

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadPathArray
          (CrateReader *this,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *d)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  ssize_t sVar4;
  value_type *rhs;
  char *pcVar5;
  long lVar6;
  size_t i;
  uint64_t n;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> ivalue;
  ostringstream ss_e;
  optional<tinyusdz::Path> pv;
  uint64_t local_2f0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_2e8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_2c8;
  string *local_2c0;
  _Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> local_2b8 [2];
  optional<tinyusdz::Path> local_280;
  optional<tinyusdz::Path> local_108;
  
  local_2e8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0 = 0;
  bVar1 = StreamReader::read8(this->_sr,&local_2f0);
  if (bVar1) {
    if ((this->_config).maxArrayElements < local_2f0) {
      ::std::__cxx11::string::append((char *)&this->_err);
      goto LAB_0017e688;
    }
    uVar2 = local_2f0 * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar2;
    if (uVar2 <= (this->_config).maxMemoryBudget) {
      ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
                ((vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *)
                 local_2b8,local_2f0,(allocator_type *)&local_280);
      sVar4 = StreamReader::read(this->_sr,(int)(void *)(local_2f0 << 2),(void *)(local_2f0 << 2),
                                 (size_t)local_2b8[0]._M_impl.super__Vector_impl_data._M_start);
      if (sVar4 == 0) {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      else {
        local_2c8 = d;
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::resize(&local_2e8,local_2f0)
        ;
        local_2c0 = (string *)&this->_err;
        lVar6 = 0;
        uVar2 = 0;
        do {
          if (local_2f0 <= uVar2) {
            ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
            ~_Vector_base(local_2b8);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2c8,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_2e8);
            bVar1 = true;
            goto LAB_0017e6a0;
          }
          GetPath(&local_280,this,
                  (Index)local_2b8[0]._M_impl.super__Vector_impl_data._M_start[uVar2].value);
          nonstd::optional_lite::optional<tinyusdz::Path>::optional<tinyusdz::Path,_0>
                    (&local_108,&local_280);
          nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_280);
          bVar1 = local_108.has_value_;
          if (local_108.has_value_ == true) {
            rhs = nonstd::optional_lite::optional<tinyusdz::Path>::value(&local_108);
            Path::operator=((Path *)((long)&((local_2e8.
                                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->_prim_part
                                            )._M_dataplus._M_p + lVar6),rhs);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
            poVar3 = ::std::operator<<((ostream *)&local_280,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"operator()");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x47e);
            ::std::operator<<(poVar3," ");
            poVar3 = ::std::operator<<((ostream *)&local_280,"Invalid Index for Path.");
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append(local_2c0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_280);
          }
          nonstd::optional_lite::optional<tinyusdz::Path>::~optional(&local_108);
          uVar2 = uVar2 + 1;
          lVar6 = lVar6 + 0xd0;
        } while (bVar1 != false);
      }
      ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
      ~_Vector_base(local_2b8);
      goto LAB_0017e688;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
    poVar3 = ::std::operator<<((ostream *)&local_280,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"operator()");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x46d);
    ::std::operator<<(poVar3," ");
    pcVar5 = "Reached to max memory budget.";
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
    poVar3 = ::std::operator<<((ostream *)&local_280,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"operator()");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x464);
    ::std::operator<<(poVar3," ");
    pcVar5 = "Failed to read the number of array elements.";
  }
  poVar3 = ::std::operator<<((ostream *)&local_280,pcVar5);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_280);
LAB_0017e688:
  ::std::__cxx11::string::append((char *)&this->_err);
  bVar1 = false;
LAB_0017e6a0:
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_2e8);
  return bVar1;
}

Assistant:

bool CrateReader::ReadPathArray(std::vector<Path> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<Path> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many Path array elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      _err += "Failed to read ListOp data.\n";
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto pv = GetPath(ivalue[i])) {
        result[i] = pv.value();
      } else {
        PUSH_ERROR("Invalid Index for Path.");
        return false;
      }
    }

    return true;
  };

  std::vector<Path> items;
  if (!ReadFn(items)) {
    _err += "Failed to read Path vector.\n";
    return false;
  }

  (*d) = items;

  return true;
}